

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

void __thiscall
Centaurus::ATNMachine<wchar_t>::add_transition_from(ATNMachine<wchar_t> *this,int src)

{
  pointer pAVar1;
  
  pAVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ATNNode<wchar_t>::add_transition
            (pAVar1 + src,
             (int)(((long)(this->m_nodes).
                          super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x98) + -1,0)
  ;
  return;
}

Assistant:

void add_transition_from(int src)
    {
        m_nodes[src].add_transition(m_nodes.size() - 1);
    }